

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function.cpp
# Opt level: O2

void __thiscall
duckdb::TableFunction::TableFunction
          (TableFunction *this,string *name,vector<duckdb::LogicalType,_true> *arguments,
          table_function_t function,table_function_bind_t bind,
          table_function_init_global_t init_global,table_function_init_local_t init_local)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88;
  string local_68;
  LogicalType local_48;
  
  ::std::__cxx11::string::string((string *)&local_68,(string *)name);
  local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_48,INVALID);
  SimpleNamedParameterFunction::SimpleNamedParameterFunction
            (&this->super_SimpleNamedParameterFunction,&local_68,
             (vector<duckdb::LogicalType,_true> *)&local_88,&local_48);
  LogicalType::~LogicalType(&local_48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  (this->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_0278cb88;
  this->bind = bind;
  this->bind_replace = (table_function_bind_replace_t)0x0;
  this->bind_operator = (table_function_bind_operator_t)0x0;
  this->init_global = init_global;
  this->init_local = init_local;
  this->function = function;
  switchD_016d4fed::default(&this->in_out_function,0,0xa0);
  this->verify_serialization = true;
  this->projection_pushdown = false;
  this->filter_pushdown = false;
  this->filter_prune = false;
  this->sampling_pushdown = false;
  this->late_materialization = false;
  (this->function_info).internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->function_info).internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->global_initialization = INITIALIZE_ON_EXECUTE;
  return;
}

Assistant:

TableFunction::TableFunction(string name, vector<LogicalType> arguments, table_function_t function,
                             table_function_bind_t bind, table_function_init_global_t init_global,
                             table_function_init_local_t init_local)
    : SimpleNamedParameterFunction(std::move(name), std::move(arguments)), bind(bind), bind_replace(nullptr),
      bind_operator(nullptr), init_global(init_global), init_local(init_local), function(function),
      in_out_function(nullptr), in_out_function_final(nullptr), statistics(nullptr), dependency(nullptr),
      cardinality(nullptr), pushdown_complex_filter(nullptr), pushdown_expression(nullptr), to_string(nullptr),
      dynamic_to_string(nullptr), table_scan_progress(nullptr), get_partition_data(nullptr), get_bind_info(nullptr),
      type_pushdown(nullptr), get_multi_file_reader(nullptr), supports_pushdown_type(nullptr),
      get_partition_info(nullptr), get_partition_stats(nullptr), get_virtual_columns(nullptr), serialize(nullptr),
      deserialize(nullptr), projection_pushdown(false), filter_pushdown(false), filter_prune(false),
      sampling_pushdown(false), late_materialization(false) {
}